

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-mysqlaux.c
# Opt level: O0

int quote_sql_str(lua_State *L)

{
  int iVar1;
  uint uVar2;
  uchar *src_00;
  size_t size;
  char *s;
  uchar *dst_00;
  uchar *dst;
  uchar *src;
  uchar *p;
  size_t escape;
  size_t dlen;
  size_t len;
  lua_State *L_local;
  
  len = (size_t)L;
  iVar1 = lua_gettop(L);
  if (iVar1 == 1) {
    src_00 = (uchar *)luaL_checklstring((lua_State *)len,1,&dlen);
    if (dlen == 0) {
      lua_pushlstring((lua_State *)len,"\'\'",2);
      L_local._4_4_ = 1;
    }
    else {
      uVar2 = num_escape_sql_str((uchar *)0x0,src_00,dlen);
      size = dlen + 2 + (ulong)uVar2;
      s = (char *)lua_newuserdata((lua_State *)len,size);
      dst_00 = (uchar *)(s + 1);
      *s = '\'';
      if ((ulong)uVar2 == 0) {
        memcpy(dst_00,src_00,dlen);
        src = dst_00 + dlen;
      }
      else {
        src = escape_sql_str(dst_00,src_00,dlen);
      }
      *src = '\'';
      if (src + 1 == (uchar *)(s + size)) {
        lua_pushlstring((lua_State *)len,s,(long)(src + 1) - (long)s);
        L_local._4_4_ = 1;
      }
      else {
        L_local._4_4_ = luaL_error((lua_State *)len,"quote sql string error");
      }
    }
  }
  else {
    L_local._4_4_ = luaL_error((lua_State *)len,"expecting one argument");
  }
  return L_local._4_4_;
}

Assistant:

static int
quote_sql_str(lua_State *L)
{
    size_t                   len, dlen, escape;
    unsigned char                  *p;
    unsigned char                  *src, *dst;
    
    if (lua_gettop(L) != 1) {
        return luaL_error(L, "expecting one argument");
    }
    
    src = (unsigned char *) luaL_checklstring(L, 1, &len);
    
    if (len == 0) {
        dst = (unsigned char *) "''";
        dlen = sizeof("''") - 1;
        lua_pushlstring(L, (char *) dst, dlen);
        return 1;
    }
    
    escape = num_escape_sql_str(NULL, src, len);
    
    dlen = sizeof("''") - 1 + len + escape;
    p = lua_newuserdata(L, dlen);
    
    dst = p;
    
    *p++ = '\'';
    
    if (escape == 0) {
        memcpy(p, src, len);
        p+=len;
    } else {
        p = (unsigned char *) escape_sql_str(p, src, len);
    }
    
    *p++ = '\'';
    
    if (p != dst + dlen) {
        return luaL_error(L, "quote sql string error");
    }
    
    lua_pushlstring(L, (char *) dst, p - dst);
    
    return 1;
}